

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputContactMessageContent.h
# Opt level: O3

void __thiscall
TgBot::InputContactMessageContent::InputContactMessageContent(InputContactMessageContent *this)

{
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"InputContactMessageContent","");
  (this->super_InputMessageContent)._vptr_InputMessageContent =
       (_func_int **)&PTR__InputMessageContent_002a6a18;
  (this->super_InputMessageContent).type._M_dataplus._M_p =
       (pointer)&(this->super_InputMessageContent).type.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_InputMessageContent).type,local_38,local_38 + local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  (this->super_InputMessageContent)._vptr_InputMessageContent =
       (_func_int **)&PTR__InputContactMessageContent_002a6b98;
  (this->phoneNumber)._M_dataplus._M_p = (pointer)&(this->phoneNumber).field_2;
  (this->phoneNumber)._M_string_length = 0;
  (this->phoneNumber).field_2._M_local_buf[0] = '\0';
  (this->firstName)._M_dataplus._M_p = (pointer)&(this->firstName).field_2;
  (this->firstName)._M_string_length = 0;
  (this->firstName).field_2._M_local_buf[0] = '\0';
  (this->lastName)._M_dataplus._M_p = (pointer)&(this->lastName).field_2;
  (this->lastName)._M_string_length = 0;
  (this->lastName).field_2._M_local_buf[0] = '\0';
  (this->vcard)._M_dataplus._M_p = (pointer)&(this->vcard).field_2;
  (this->vcard)._M_string_length = 0;
  (this->vcard).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

InputContactMessageContent() :
        InputMessageContent("InputContactMessageContent")
    {}